

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

ArrayPtr<const_capnp::word> __thiscall
capnp::FlatArrayMessageReader::getSegment(FlatArrayMessageReader *this,uint id)

{
  ArrayPtr<const_capnp::word> AVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  uint id_local;
  FlatArrayMessageReader *this_local;
  size_t local_10;
  
  if (id == 0) {
    this_local = (FlatArrayMessageReader *)(this->segment0).ptr;
    local_10 = (this->segment0).size_;
  }
  else {
    sVar2 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::size(&this->moreSegments);
    if (sVar2 < id) {
      kj::ArrayPtr<const_capnp::word>::ArrayPtr
                ((ArrayPtr<const_capnp::word> *)&this_local,(void *)0x0);
    }
    else {
      pAVar3 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator[]
                         (&this->moreSegments,(ulong)(id - 1));
      this_local = (FlatArrayMessageReader *)pAVar3->ptr;
      local_10 = pAVar3->size_;
    }
  }
  AVar1.size_ = local_10;
  AVar1.ptr = (word *)this_local;
  return AVar1;
}

Assistant:

kj::ArrayPtr<const word> FlatArrayMessageReader::getSegment(uint id) {
  if (id == 0) {
    return segment0;
  } else if (id <= moreSegments.size()) {
    return moreSegments[id - 1];
  } else {
    return nullptr;
  }
}